

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

bool __thiscall
ON_Brep::CollapseEdge(ON_Brep *this,int edge_index,bool bCloseTrimGap,int vertex_index)

{
  int iVar1;
  ON_BrepTrim *pOVar2;
  int iVar3;
  ON_BrepEdge *pOVar4;
  ON_BrepVertex *pOVar5;
  undefined7 in_register_00000011;
  long lVar6;
  size_t new_capacity;
  int *x;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  int i;
  ON_SimpleArray<int> ti;
  ON_SimpleArray<int> next_ti;
  ON_SimpleArray<int> prev_ti;
  ON_SimpleArray<int> li;
  int local_bc;
  ON_BrepEdge *local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  undefined4 local_a4;
  ON_SimpleArray<int> local_a0;
  long local_88;
  size_t local_80;
  ON_SimpleArray<int> local_78;
  ON_SimpleArray<int> local_60;
  ON_SimpleArray<int> local_48;
  
  local_a4 = (undefined4)CONCAT71(in_register_00000011,bCloseTrimGap);
  pOVar4 = Edge(this,edge_index);
  if (pOVar4 != (ON_BrepEdge *)0x0) {
    local_a8 = pOVar4->m_vi[0];
    iVar3 = pOVar4->m_vi[1];
    if (vertex_index == -1) {
      vertex_index = local_a8;
    }
    pOVar5 = Vertex(this,vertex_index);
    if (pOVar5 != (ON_BrepVertex *)0x0) {
      new_capacity = (size_t)(pOVar4->m_ti).m_count;
      local_ac = iVar3;
      if (0 < (long)new_capacity) {
        iVar3 = pOVar5->m_vertex_index;
        local_a0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
        local_a0.m_a = (int *)0x0;
        local_a0.m_count = 0;
        local_a0.m_capacity = 0;
        local_b8 = pOVar4;
        ON_SimpleArray<int>::SetCapacity(&local_a0,new_capacity);
        local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
        local_48.m_a = (int *)0x0;
        local_48.m_count = 0;
        local_48.m_capacity = 0;
        ON_SimpleArray<int>::SetCapacity(&local_48,new_capacity);
        local_60._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
        local_60.m_a = (int *)0x0;
        local_60.m_count = 0;
        local_60.m_capacity = 0;
        ON_SimpleArray<int>::SetCapacity(&local_60,new_capacity);
        local_78._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
        local_78.m_a = (int *)0x0;
        local_78.m_count = 0;
        local_78.m_capacity = 0;
        local_b0 = iVar3;
        ON_SimpleArray<int>::SetCapacity(&local_78,new_capacity);
        local_88 = -new_capacity;
        bVar9 = true;
        uVar7 = 1;
        local_80 = new_capacity;
        do {
          local_bc = (local_b8->m_ti).m_a[uVar7 - 1];
          lVar6 = (long)local_bc;
          if ((-1 < lVar6) &&
             (local_bc <
              (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count
             )) {
            pOVar2 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                     m_a;
            if ((pOVar2[lVar6].m_trim_index == local_bc) &&
               ((((-1 < pOVar2[lVar6].m_li &&
                  (pOVar2[lVar6].m_li <
                   (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                   m_count)) && (local_bc = PrevTrim(this,local_bc), -1 < local_bc)) &&
                (x = &pOVar2[lVar6].m_trim_index, local_bc != *x)))) {
              ON_SimpleArray<int>::Append(&local_60,&local_bc);
              local_bc = NextTrim(this,*x);
              if ((-1 < local_bc) && (local_bc != *x)) {
                ON_SimpleArray<int>::Append(&local_78,&local_bc);
                ON_SimpleArray<int>::Append(&local_a0,x);
                ON_SimpleArray<int>::Append(&local_48,&pOVar2[lVar6].m_li);
                goto LAB_00416de5;
              }
            }
            ON_SimpleArray<int>::~ON_SimpleArray(&local_78);
            ON_SimpleArray<int>::~ON_SimpleArray(&local_60);
            ON_SimpleArray<int>::~ON_SimpleArray(&local_48);
            ON_SimpleArray<int>::~ON_SimpleArray(&local_a0);
            pOVar4 = local_b8;
            if (bVar9) {
              return false;
            }
            goto LAB_00416f25;
          }
LAB_00416de5:
          iVar3 = local_b0;
          pOVar4 = local_b8;
          bVar9 = uVar7 < local_80;
          lVar6 = local_88 + uVar7;
          uVar7 = uVar7 + 1;
        } while (lVar6 != 0);
        ChangeVertex(this,local_b8->m_vi[0],local_b0,true);
        ChangeVertex(this,pOVar4->m_vi[1],iVar3,true);
        lVar6 = (long)local_a0.m_count;
        if (0 < lVar6) {
          lVar8 = 0;
          do {
            local_bc = local_a0.m_a[lVar8];
            pOVar2 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                     m_a;
            iVar3 = local_60.m_a[lVar8];
            iVar1 = local_78.m_a[lVar8];
            DeleteTrim(this,pOVar2 + local_bc,false);
            if ((char)local_a4 != '\0') {
              CloseTrimGap(this,pOVar2 + iVar3,pOVar2 + iVar1);
            }
            lVar8 = lVar8 + 1;
          } while (lVar6 != lVar8);
        }
        ON_SimpleArray<int>::~ON_SimpleArray(&local_78);
        ON_SimpleArray<int>::~ON_SimpleArray(&local_60);
        ON_SimpleArray<int>::~ON_SimpleArray(&local_48);
        ON_SimpleArray<int>::~ON_SimpleArray(&local_a0);
        pOVar4 = local_b8;
      }
LAB_00416f25:
      DeleteEdge(this,pOVar4,false);
      pOVar5 = Vertex(this,local_a8);
      if ((pOVar5 != (ON_BrepVertex *)0x0) && (iVar3 = ON_BrepVertex::EdgeCount(pOVar5), iVar3 == 0)
         ) {
        DeleteVertex(this,pOVar5);
      }
      pOVar5 = Vertex(this,local_ac);
      if (pOVar5 != (ON_BrepVertex *)0x0) {
        iVar3 = ON_BrepVertex::EdgeCount(pOVar5);
        if (iVar3 == 0) {
          DeleteVertex(this,pOVar5);
          return true;
        }
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Brep::CollapseEdge( int edge_index, bool bCloseTrimGap, int vertex_index  )
{
  ON_BrepEdge* edge = Edge(edge_index);
  if ( 0 == edge )
    return false;
  edge_index = edge->m_edge_index; // clear high bit

  int orig_vid0 = edge->m_vi[0];
  int orig_vid1 = edge->m_vi[1];

  if ( -1 == vertex_index )
    vertex_index = edge->m_vi[0];
  ON_BrepVertex* vertex = Vertex(vertex_index);
  if ( 0 == vertex )
    return false;
  vertex_index = vertex->m_vertex_index; // clear high bit

  int trim_count = edge->m_ti.Count();
  if ( trim_count > 0 )
  {
    ON_SimpleArray<int> ti(trim_count);
    ON_SimpleArray<int> li(trim_count);
    ON_SimpleArray<int> prev_ti(trim_count);
    ON_SimpleArray<int> next_ti(trim_count);
    int i, eti;
    for ( eti = 0; eti < trim_count; eti++ )
    {
      i = edge->m_ti[eti];
      if ( i < 0 || i >= m_T.Count() )
        continue;
      const ON_BrepTrim& trim = m_T[i];
      if ( trim.m_trim_index != i )
        return false;
      if ( trim.m_li < 0 || trim.m_li >= m_L.Count() )
        return false;
      i = PrevTrim(trim.m_trim_index);
      if ( i < 0 || i == trim.m_trim_index )
        return false;
      prev_ti.Append(i);
      i = NextTrim(trim.m_trim_index);
      if ( i < 0 || i == trim.m_trim_index )
        return false;
      next_ti.Append(i);
      ti.Append(trim.m_trim_index);
      li.Append(trim.m_li);
    }

    ChangeVertex(edge->m_vi[0], vertex_index, true);
    ChangeVertex(edge->m_vi[1], vertex_index, true);
    
    trim_count = ti.Count();
    for ( eti = 0; eti < trim_count; eti++ )
    {
      i = ti[eti];
      ON_BrepTrim& trim = m_T[i];
      //ON_BrepLoop& loop = m_L[li[eti]];
      ON_BrepTrim& prev_trim = m_T[prev_ti[eti]];
      ON_BrepTrim& next_trim = m_T[next_ti[eti]];
      DeleteTrim(trim,false);
      if ( bCloseTrimGap )
        CloseTrimGap(prev_trim,next_trim);
    }
  }

  DeleteEdge(*edge,false);
  ON_BrepVertex* V0 = Vertex(orig_vid0);
  if (V0 && V0->EdgeCount() == 0)
    DeleteVertex(*V0);
  ON_BrepVertex* V1 = Vertex(orig_vid1);
  if (V1 && V1->EdgeCount() == 0)
    DeleteVertex(*V1);
  return true;
}